

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_soundex(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uchar uVar1;
  int iVar2;
  undefined8 in_RAX;
  byte *pbVar3;
  ushort **ppuVar4;
  ulong uVar5;
  __int32_t **pp_Var6;
  uchar uVar7;
  long lVar8;
  char *zString;
  jx9_value *pVal;
  byte bVar9;
  char zResult [8];
  undefined8 local_38;
  
  zString = (char *)&local_38;
  local_38 = in_RAX;
  if (nArg < 1) {
    pVal = pCtx->pRet;
    zString = "";
    iVar2 = 0;
  }
  else {
    uVar5 = 0;
    pbVar3 = (byte *)jx9_value_to_string(*apArg,(int *)0x0);
    bVar9 = *pbVar3;
    if ((byte)(bVar9 - 1) < 0xbf) {
      ppuVar4 = __ctype_b_loc();
      uVar5 = 0;
      do {
        if ((*(byte *)((long)*ppuVar4 + (ulong)bVar9 * 2 + 1) & 4) != 0) break;
        bVar9 = pbVar3[uVar5 + 1];
        uVar5 = uVar5 + 1;
      } while ((byte)(bVar9 - 1) < 0xbf);
      uVar5 = uVar5 & 0xffffffff;
    }
    if (bVar9 == 0) {
      pVal = pCtx->pRet;
      zString = "?000";
    }
    else {
      uVar7 = ""[bVar9 & 0x7f];
      pp_Var6 = __ctype_toupper_loc();
      local_38 = CONCAT71(local_38._1_7_,(char)(*pp_Var6)[bVar9]);
      pbVar3 = pbVar3 + uVar5;
      iVar2 = 1;
      do {
        if (*pbVar3 == 0) break;
        uVar1 = ""[*pbVar3 & 0x7f];
        if (uVar1 == '\0') {
          uVar7 = '\0';
        }
        else if (uVar1 != uVar7) {
          lVar8 = (long)iVar2;
          iVar2 = iVar2 + 1;
          *(uchar *)((long)&local_38 + lVar8) = uVar1 + '0';
          uVar7 = uVar1;
        }
        pbVar3 = pbVar3 + 1;
      } while (iVar2 < 4);
      if (iVar2 < 4) {
        memset((void *)((long)&local_38 + (long)iVar2),0x30,(ulong)(3 - iVar2) + 1);
      }
      pVal = pCtx->pRet;
    }
    iVar2 = 4;
  }
  jx9_value_string(pVal,zString,iVar2);
  return 0;
}

Assistant:

static int jx9Builtin_soundex(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const unsigned char *zIn;
	char zResult[8];
	int i, j;
	static const unsigned char iCode[] = {
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
		0, 0, 1, 2, 3, 0, 1, 2, 0, 0, 2, 2, 4, 5, 5, 0, 
		1, 2, 6, 2, 3, 0, 1, 0, 2, 0, 2, 0, 0, 0, 0, 0, 
		0, 0, 1, 2, 3, 0, 1, 2, 0, 0, 2, 2, 4, 5, 5, 0, 
		1, 2, 6, 2, 3, 0, 1, 0, 2, 0, 2, 0, 0, 0, 0, 0, 
	};
	if( nArg < 1 ){
		/* Missing arguments, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	zIn = (unsigned char *)jx9_value_to_string(apArg[0], 0);
	for(i=0; zIn[i] && zIn[i] < 0xc0 && !SyisAlpha(zIn[i]); i++){}
	if( zIn[i] ){
		unsigned char prevcode = iCode[zIn[i]&0x7f];
		zResult[0] = (char)SyToUpper(zIn[i]);
		for(j=1; j<4 && zIn[i]; i++){
			int code = iCode[zIn[i]&0x7f];
			if( code>0 ){
				if( code!=prevcode ){
					prevcode = (unsigned char)code;
					zResult[j++] = (char)code + '0';
				}
			}else{
				prevcode = 0;
			}
		}
		while( j<4 ){
			zResult[j++] = '0';
		}
		jx9_result_string(pCtx, zResult, 4);
	}else{
	  jx9_result_string(pCtx, "?000", 4);
	}
	return JX9_OK;
}